

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

int ImGui::DataTypeCompare(ImGuiDataType data_type,void *arg_1,void *arg_2)

{
  int iVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  
  switch(data_type) {
  case 0:
    cVar2 = *arg_1;
    cVar3 = *arg_2;
    bVar13 = SBORROW1(cVar2,cVar3);
    bVar12 = (char)(cVar2 - cVar3) < '\0';
    bVar11 = cVar2 == cVar3;
    goto LAB_001a0752;
  case 1:
    bVar10 = *arg_1 < *arg_2;
    bVar11 = *arg_1 == *arg_2;
    break;
  case 2:
    sVar4 = *arg_1;
    sVar5 = *arg_2;
    bVar13 = SBORROW2(sVar4,sVar5);
    bVar12 = (short)(sVar4 - sVar5) < 0;
    bVar11 = sVar4 == sVar5;
    goto LAB_001a0752;
  case 3:
    bVar10 = *arg_1 < *arg_2;
    bVar11 = *arg_1 == *arg_2;
    break;
  case 4:
    iVar6 = *arg_1;
    iVar1 = *arg_2;
    bVar13 = SBORROW4(iVar6,iVar1);
    bVar12 = iVar6 - iVar1 < 0;
    bVar11 = iVar6 == iVar1;
    goto LAB_001a0752;
  case 5:
    bVar10 = *arg_1 < *arg_2;
    bVar11 = *arg_1 == *arg_2;
    break;
  case 6:
    lVar7 = *arg_1;
    lVar8 = *arg_2;
    bVar13 = SBORROW8(lVar7,lVar8);
    bVar12 = lVar7 - lVar8 < 0;
    bVar11 = lVar7 == lVar8;
LAB_001a0752:
    bVar10 = bVar13 != bVar12;
    bVar11 = !bVar11 && bVar13 == bVar12;
    goto LAB_001a0758;
  case 7:
    bVar10 = *arg_1 < *arg_2;
    bVar11 = *arg_1 == *arg_2;
    break;
  case 8:
    bVar11 = *arg_1 == *arg_2;
    bVar10 = *arg_1 < *arg_2;
    break;
  case 9:
    bVar11 = *arg_1 == *arg_2;
    bVar10 = *arg_1 < *arg_2;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_widgets.cpp"
                  ,0x81a,"int ImGui::DataTypeCompare(ImGuiDataType, const void *, const void *)");
  }
  bVar11 = !bVar10 && !bVar11;
LAB_001a0758:
  uVar9 = 0xffffffff;
  if (!bVar10) {
    uVar9 = (uint)bVar11;
  }
  return uVar9;
}

Assistant:

int ImGui::DataTypeCompare(ImGuiDataType data_type, const void* arg_1, const void* arg_2)
{
    switch (data_type)
    {
    case ImGuiDataType_S8:     return DataTypeCompareT<ImS8  >((const ImS8*  )arg_1, (const ImS8*  )arg_2);
    case ImGuiDataType_U8:     return DataTypeCompareT<ImU8  >((const ImU8*  )arg_1, (const ImU8*  )arg_2);
    case ImGuiDataType_S16:    return DataTypeCompareT<ImS16 >((const ImS16* )arg_1, (const ImS16* )arg_2);
    case ImGuiDataType_U16:    return DataTypeCompareT<ImU16 >((const ImU16* )arg_1, (const ImU16* )arg_2);
    case ImGuiDataType_S32:    return DataTypeCompareT<ImS32 >((const ImS32* )arg_1, (const ImS32* )arg_2);
    case ImGuiDataType_U32:    return DataTypeCompareT<ImU32 >((const ImU32* )arg_1, (const ImU32* )arg_2);
    case ImGuiDataType_S64:    return DataTypeCompareT<ImS64 >((const ImS64* )arg_1, (const ImS64* )arg_2);
    case ImGuiDataType_U64:    return DataTypeCompareT<ImU64 >((const ImU64* )arg_1, (const ImU64* )arg_2);
    case ImGuiDataType_Float:  return DataTypeCompareT<float >((const float* )arg_1, (const float* )arg_2);
    case ImGuiDataType_Double: return DataTypeCompareT<double>((const double*)arg_1, (const double*)arg_2);
    case ImGuiDataType_COUNT:  break;
    }
    IM_ASSERT(0);
    return 0;
}